

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

array<cv::Mat,_10UL> *
compute_target_ring_mask
          (array<cv::Mat,_10UL> *__return_storage_ptr__,
          array<cv::RotatedRect,_10UL> *target_ellipses,int img_row,int img_col,bool debug)

{
  anon_class_8_2_0534cb4b __unary_op;
  const_iterator pvVar1;
  const_iterator pvVar2;
  iterator pvVar3;
  iterator __last;
  iterator __result;
  undefined1 local_118 [8];
  array<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_10UL> target_contours;
  bool debug_local;
  int img_col_local;
  int img_row_local;
  array<cv::RotatedRect,_10UL> *target_ellipses_local;
  array<cv::Mat,_10UL> *target_ring_mask;
  
  target_contours._M_elems[9].super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = debug;
  std::array<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_10UL>::array
            ((array<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_10UL> *)
             local_118);
  pvVar1 = std::array<cv::RotatedRect,_10UL>::begin(target_ellipses);
  pvVar2 = std::array<cv::RotatedRect,_10UL>::end(target_ellipses);
  pvVar3 = std::array<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_10UL>::begin
                     ((array<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_10UL>
                       *)local_118);
  std::
  transform<cv::RotatedRect_const*,std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>*,compute_target_ring_mask(std::array<cv::RotatedRect,10ul>const&,int,int,bool)::__0>
            (pvVar1,pvVar2,pvVar3);
  std::array<cv::Mat,_10UL>::array(__return_storage_ptr__);
  pvVar3 = std::array<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_10UL>::begin
                     ((array<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_10UL>
                       *)local_118);
  __last = std::array<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_10UL>::end
                     ((array<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_10UL>
                       *)local_118);
  __result = std::array<cv::Mat,_10UL>::begin(__return_storage_ptr__);
  __unary_op.img_col = img_col;
  __unary_op.img_row = img_row;
  std::
  transform<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>*,cv::Mat*,compute_target_ring_mask(std::array<cv::RotatedRect,10ul>const&,int,int,bool)::__1>
            (pvVar3,__last,__result,__unary_op);
  std::array<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_10UL>::~array
            ((array<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_10UL> *)
             local_118);
  return __return_storage_ptr__;
}

Assistant:

std::array<cv::Mat, 10> compute_target_ring_mask(
    const std::array<cv::RotatedRect, 10>& target_ellipses, int img_row, int img_col, bool debug = false)
{
    std::array<std::vector<cv::Point>, 10> target_contours;
    std::transform(
        target_ellipses.begin(), target_ellipses.end(), target_contours.begin(), [](const cv::RotatedRect& rect) {
            std::vector<cv::Point> result;
            cv::Size2f size(rect.size.width / 2.f, rect.size.height / 2.f);
            cv::ellipse2Poly(rect.center, size, static_cast<int>(rect.angle), 0, 360, 1, result);
            return result;
        });

    std::array<cv::Mat, 10> target_ring_mask;
    std::transform(target_contours.begin(), target_contours.end(), target_ring_mask.begin(),
        [img_row, img_col](const std::vector<cv::Point>& contours_pts) {
            cv::Mat result = cv::Mat::zeros(img_row, img_col, CV_8U);
            cv::fillConvexPoly(result, contours_pts, 255);
            return result;
        });

    // display_target_contours_masks(target_ring_mask.begin(), target_ring_mask.end());
    return target_ring_mask;
}